

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O1

void __thiscall
coro_io::basic_seq_coro_file<(coro_io::execution_type)1>::basic_seq_coro_file
          (basic_seq_coro_file<(coro_io::execution_type)1> *this,executor_type *executor)

{
  basic_executor_type<std::allocator<void>,_0UL> local_18;
  
  local_18.target_ = executor->target_;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(&this->executor_wrapper_,&local_18);
  std::fstream::fstream(&this->frw_seq_file_);
  (this->file_path_)._M_dataplus._M_p = (pointer)&(this->file_path_).field_2;
  (this->file_path_)._M_string_length = 0;
  (this->file_path_).field_2._M_local_buf[0] = '\0';
  this->eof_ = false;
  return;
}

Assistant:

basic_seq_coro_file(asio::io_context::executor_type executor)
      : executor_wrapper_(executor) {}